

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

void __thiscall
ParserTestDuplicateRuleInDifferentSubninjasWithInclude::Run
          (ParserTestDuplicateRuleInDifferentSubninjasWithInclude *this)

{
  Test *this_00;
  bool condition;
  allocator<char> local_169;
  string local_168;
  undefined1 local_148 [8];
  string err;
  undefined1 local_120 [8];
  ManifestParser parser;
  string local_b8;
  allocator<char> local_91;
  string local_90;
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  ParserTestDuplicateRuleInDifferentSubninjasWithInclude *local_10;
  ParserTestDuplicateRuleInDifferentSubninjasWithInclude *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"rules.ninja",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"rule cat\n  command = cat\n",&local_69);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_90,"test.ninja",&local_91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"include rules.ninja\nbuild x : cat\n",
             (allocator<char> *)&parser.field_0x5f);
  VirtualFileSystem::Create(&(this->super_ParserTest).fs_,&local_90,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&parser.field_0x5f);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator(&local_91);
  ManifestParserOptions::ManifestParserOptions((ManifestParserOptions *)((long)&err.field_2 + 8));
  ManifestParser::ManifestParser
            ((ManifestParser *)local_120,&(this->super_ParserTest).state,
             (FileReader *)&(this->super_ParserTest).fs_,(ManifestParserOptions)err.field_2._8_8_);
  std::__cxx11::string::string((string *)local_148);
  this_00 = g_current_test;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_168,"include rules.ninja\nsubninja test.ninja\nbuild y : cat\n",
             &local_169);
  condition = ManifestParser::ParseTest((ManifestParser *)local_120,&local_168,(string *)local_148);
  testing::Test::Check
            (this_00,condition,
             "/workspace/llm4binary/github/license_all_cmakelists_25/adityavs[P]ninja/src/manifest_parser_test.cc"
             ,0x39d,
             "parser.ParseTest(\"include rules.ninja\\n\" \"subninja test.ninja\\n\" \"build y : cat\\n\", &err)"
            );
  std::__cxx11::string::~string((string *)&local_168);
  std::allocator<char>::~allocator(&local_169);
  std::__cxx11::string::~string((string *)local_148);
  return;
}

Assistant:

TEST_F(ParserTest, DuplicateRuleInDifferentSubninjasWithInclude) {
  // Test that rules are scoped to subninjas even with includes.
  fs_.Create("rules.ninja", "rule cat\n"
                         "  command = cat\n");
  fs_.Create("test.ninja", "include rules.ninja\n"
                         "build x : cat\n");
  ManifestParser parser(&state, &fs_);
  string err;
  EXPECT_TRUE(parser.ParseTest("include rules.ninja\n"
                                "subninja test.ninja\n"
                                "build y : cat\n", &err));
}